

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test10::compare
          (GPUShaderFP64Test10 *this,_variable_type type,GLvoid *left,GLvoid *right)

{
  uint uVar1;
  _variable_type _Var2;
  TestError *this_00;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = Utils::getNumberOfComponentsForVariableType(type);
  _Var2 = Utils::getBaseVariableType(type);
  if (_Var2 == VARIABLE_TYPE_DOUBLE) {
    uVar3 = 0;
    do {
      dVar7 = *(double *)((long)left + uVar3 * 8);
      dVar8 = *(double *)((long)right + uVar3 * 8);
      if (((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) && (!NAN(dVar8) && !NAN(dVar7))) {
        dVar7 = dVar7 - dVar8;
        dVar8 = -dVar7;
        if (-dVar7 <= dVar7) {
          dVar8 = dVar7;
        }
        if (2e-05 < dVar8) {
          return false;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    bVar5 = true;
  }
  else if (_Var2 == VARIABLE_TYPE_INT) {
    lVar4 = 0;
    do {
      bVar5 = *(int *)((long)left + lVar4 * 4) == *(int *)((long)right + lVar4 * 4);
      if (!bVar5) {
        return bVar5;
      }
      bVar6 = (ulong)uVar1 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar6);
  }
  else {
    if (_Var2 != VARIABLE_TYPE_UINT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x353d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar4 = 0;
    do {
      bVar5 = *(int *)((long)left + lVar4 * 4) == *(int *)((long)right + lVar4 * 4);
      if (!bVar5) {
        return bVar5;
      }
      bVar6 = (ulong)uVar1 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool GPUShaderFP64Test10::compare(Utils::_variable_type type, const glw::GLvoid* left, const glw::GLvoid* right)
{
	bool result = true;

	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);

	switch (base_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:

	{
		const glw::GLdouble* left_values  = (glw::GLdouble*)left;
		const glw::GLdouble* right_values = (glw::GLdouble*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble left_value  = left_values[component];
			const glw::GLdouble right_value = right_values[component];

			if ((left_value != right_value) && (m_epsilon < de::abs(left_value - right_value)) &&
				(0 == Math::isnan_impl(left_value)) && (0 == Math::isnan_impl(right_value)))
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_INT:

	{
		const glw::GLint* left_values  = (glw::GLint*)left;
		const glw::GLint* right_values = (glw::GLint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint left_value  = left_values[component];
			const glw::GLint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_UINT:

	{
		const glw::GLuint* left_values  = (glw::GLuint*)left;
		const glw::GLuint* right_values = (glw::GLuint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint left_value  = left_values[component];
			const glw::GLuint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	default:

		TCU_FAIL("Not implemented");

		break;
	}

	return result;
}